

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

ON__UINT64 __thiscall
ON_SerialNumberMap::GetElements
          (ON_SerialNumberMap *this,ON__UINT64 sn0,ON__UINT64 sn1,ON__UINT64 max_count,
          ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *elements)

{
  int iVar1;
  int iVar2;
  ON__UINT64 OVar3;
  SN_ELEMENT *pSVar4;
  bool bVar5;
  SN_ELEMENT *pSStack_68;
  int elements_count0;
  SN_ELEMENT *ek;
  SN_ELEMENT *ei;
  ON__UINT64 c;
  ON__UINT64 k;
  ON__UINT64 j;
  ON__UINT64 i;
  ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *elements_local;
  ON__UINT64 max_count_local;
  ON__UINT64 sn1_local;
  ON__UINT64 sn0_local;
  ON_SerialNumberMap *this_local;
  
  iVar1 = ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Count(elements);
  if (((sn1 < sn0) || (max_count == 0)) || (this->m_sn_count <= this->m_sn_purged)) {
    return 0;
  }
  if (sn0 + 3 <= sn1) {
    ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Reserve(elements,(long)(iVar1 + 3));
    sn1_local = sn0;
    while (sn1_local <= sn1) {
      OVar3 = sn1_local + 1;
      pSVar4 = FindElementHelper(this,sn1_local);
      sn1_local = OVar3;
      if ((pSVar4 != (SN_ELEMENT *)0x0) && (pSVar4->m_sn_active != '\0')) {
        ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,pSVar4);
      }
    }
    iVar2 = ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Count(elements);
    return (long)(iVar2 - iVar1);
  }
  pSStack_68 = (SN_ELEMENT *)0x0;
  c = 0;
  for (k = 0; k < this->m_snblk_list_count; k = k + 1) {
    if (sn0 <= this->m_snblk_list[k]->m_sn1) {
      if (this->m_snblk_list[k]->m_sn0 <= sn1) {
        c = (ON__UINT64)this->m_snblk_list[k]->m_count;
        pSStack_68 = this->m_snblk_list[k]->m_sn;
        goto LAB_006b706e;
      }
      break;
    }
  }
  goto LAB_006b7171;
  while (pSVar4 = pSStack_68 + 1, pSStack_68 = pSStack_68 + 1, pSVar4->m_sn <= sn1) {
LAB_006b706e:
    bVar5 = true;
    if (sn0 <= pSStack_68->m_sn) {
      bVar5 = pSStack_68->m_sn_active == '\0';
    }
    if (!bVar5) goto LAB_006b7141;
    c = c - 1;
    if (c == 0) {
      k = k + 1;
      if ((this->m_snblk_list_count <= k) || (sn1 < this->m_snblk_list[k]->m_sn0)) {
        pSStack_68 = (SN_ELEMENT *)0x0;
        goto LAB_006b7141;
      }
      c = (ON__UINT64)this->m_snblk_list[k]->m_count;
      pSStack_68 = this->m_snblk_list[k]->m_sn;
      goto LAB_006b706e;
    }
  }
  pSStack_68 = (SN_ELEMENT *)0x0;
LAB_006b7141:
  if ((pSStack_68 != (SN_ELEMENT *)0x0) && (sn1 < pSStack_68->m_sn)) {
    pSStack_68 = (SN_ELEMENT *)0x0;
  }
LAB_006b7171:
  if (pSStack_68 == (SN_ELEMENT *)0x0) {
    ei = (SN_ELEMENT *)0x0;
  }
  else {
    ei = (SN_ELEMENT *)
         ON_SN_BLOCK::ActiveElementEstimate(this->m_snblk_list[k],pSStack_68->m_sn,sn1);
    j = k;
    while( true ) {
      j = j + 1;
      bVar5 = false;
      if (j < this->m_snblk_list_count) {
        bVar5 = this->m_snblk_list[j]->m_sn0 <= sn1;
      }
      if (!bVar5) break;
      OVar3 = ON_SN_BLOCK::ActiveElementEstimate(this->m_snblk_list[k],pSStack_68->m_sn,sn1);
      ei = (SN_ELEMENT *)((ei->m_id).Data4 + (OVar3 - 8));
    }
  }
  j = 0;
  ek = (SN_ELEMENT *)0x0;
  if ((((this->m_sn_block0->m_purged < this->m_sn_block0->m_count) &&
       (this->m_sn_block0->m_sn0 <= sn1)) && (sn0 <= this->m_sn_block0->m_sn1)) &&
     (this->m_sn_block0->m_sorted == 0)) {
    if (this->m_sn_block0->m_sorted == 0) {
      if (this->m_sn_block0->m_purged != 0) {
        Internal_HashTableInvalidate(this);
        this->m_sn_count = this->m_sn_count - (ulong)this->m_sn_block0->m_purged;
        this->m_sn_purged = this->m_sn_purged - (ulong)this->m_sn_block0->m_purged;
        ON_SN_BLOCK::CullBlockHelper(this->m_sn_block0);
        UpdateMaxSNHelper(this);
      }
      if (this->m_sn_block0->m_count != 0) {
        Internal_HashTableInvalidate(this);
        ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
        if ((this->m_sn_block0->m_sn0 <= sn1) && (sn0 <= this->m_sn_block0->m_sn1)) {
          j = (ON__UINT64)this->m_sn_block0->m_count;
          ek = this->m_sn_block0->m_sn;
        }
      }
    }
    else {
      j = (ON__UINT64)this->m_sn_block0->m_count;
      ek = this->m_sn_block0->m_sn;
      while( true ) {
        bVar5 = true;
        if (sn0 <= ek->m_sn) {
          bVar5 = ek->m_sn_active == '\0';
        }
        if (!bVar5) goto LAB_006b73ce;
        j = j - 1;
        if (j == 0) break;
        ek = ek + 1;
      }
      ek = (SN_ELEMENT *)0x0;
LAB_006b73ce:
      if ((ek != (SN_ELEMENT *)0x0) && (sn1 < ek->m_sn)) {
        ek = (SN_ELEMENT *)0x0;
      }
    }
  }
  if (ek != (SN_ELEMENT *)0x0) {
    OVar3 = ON_SN_BLOCK::ActiveElementEstimate(this->m_sn_block0,ek->m_sn,sn1);
    ei = (SN_ELEMENT *)((ei->m_id).Data4 + (OVar3 - 8));
  }
  if ((SN_ELEMENT *)((sn1 - sn0) + 1) < ei) {
    ei = (SN_ELEMENT *)((sn1 - sn0) + 1);
  }
  if ((SN_ELEMENT *)0x2000 < ei) {
    ei = (SN_ELEMENT *)0x2000;
  }
  iVar2 = ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Count(elements);
  ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Reserve(elements,(long)(iVar2 + (int)ei));
  while (ek != (SN_ELEMENT *)0x0 || pSStack_68 != (SN_ELEMENT *)0x0) {
    if ((ek == (SN_ELEMENT *)0x0) ||
       ((pSStack_68 != (SN_ELEMENT *)0x0 && (pSStack_68->m_sn <= ek->m_sn)))) {
      if (pSStack_68->m_sn_active != '\0') {
        ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,pSStack_68);
      }
      c = c - 1;
      if (c == 0) {
        k = k + 1;
        if ((k < this->m_snblk_list_count) && (sn1 <= this->m_snblk_list[k]->m_sn0)) {
          c = (ON__UINT64)this->m_snblk_list[k]->m_count;
          pSStack_68 = this->m_snblk_list[k]->m_sn;
        }
        else {
          pSStack_68 = (SN_ELEMENT *)0x0;
        }
      }
      else {
        pSVar4 = pSStack_68 + 1;
        pSStack_68 = pSStack_68 + 1;
        if (sn1 < pSVar4->m_sn) {
          pSStack_68 = (SN_ELEMENT *)0x0;
        }
      }
    }
    else {
      if (ek->m_sn_active != '\0') {
        ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append(elements,ek);
      }
      j = j - 1;
      if (j == 0) {
        ek = (SN_ELEMENT *)0x0;
      }
      else {
        pSVar4 = ek + 1;
        ek = ek + 1;
        if (sn1 < pSVar4->m_sn) {
          ek = (SN_ELEMENT *)0x0;
        }
      }
    }
  }
  iVar2 = ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Count(elements);
  return (long)(iVar2 - iVar1);
}

Assistant:

ON__UINT64 ON_SerialNumberMap::GetElements(
  ON__UINT64 sn0,
  ON__UINT64 sn1, 
  ON__UINT64 max_count,
  ON_SimpleArray<SN_ELEMENT>& elements
  ) const
{
  ON__UINT64 i,j,k,c;
  const SN_ELEMENT *ei, *ek;

  const int elements_count0 = elements.Count();

  if ( sn1 < sn0 || max_count <= 0 || m_sn_count <= m_sn_purged )
    return 0;

  if ( sn0+3 <= sn1 )
  {
    elements.Reserve(elements_count0+3);
    while ( sn0 <= sn1 )
    {
      ei = const_cast<ON_SerialNumberMap*>(this)->FindElementHelper(sn0++);
      if ( ei && ei->m_sn_active )
        elements.Append(*ei);
    }
    return (elements.Count() - elements_count0); 
  }

  ek = 0;
  k = 0;
  for ( j = 0; j < m_snblk_list_count; j++ )
  {
    if ( m_snblk_list[j]->m_sn1 < sn0 )
      continue;
    if ( sn1 < m_snblk_list[j]->m_sn0 )
      break;

    k = m_snblk_list[j]->m_count; // always > 0
    ek = &m_snblk_list[j]->m_sn[0];
    while ( ek->m_sn < sn0 || !ek->m_sn_active )
    {
      if ( --k )
      {
        if ((++ek)->m_sn > sn1)
        {
          ek = 0;
          break;
        }
      }
      else if ( ++j < m_snblk_list_count && m_snblk_list[j]->m_sn0 <= sn1 )
      {
        k = m_snblk_list[j]->m_count; // always > 0
        ek = &m_snblk_list[j]->m_sn[0];
      }
      else
      {
        ek = 0;
        break;
      }
    }
    if ( ek && ek->m_sn > sn1 )
      ek = 0;
    break;
  }

  // set c = estimate of number of items in m_snblk_list[]
  if ( ek )
  {
    c = m_snblk_list[j]->ActiveElementEstimate(ek->m_sn,sn1);
    for ( i = j+1; i < m_snblk_list_count && m_snblk_list[i]->m_sn0 <= sn1; i++ )
    {
      c += m_snblk_list[j]->ActiveElementEstimate(ek->m_sn,sn1);
    }
  }
  else
    c = 0;

  // determine where to begin searching in m_sn_block0
  i = 0;
  ei = 0;
  if (    m_sn_block0.m_count > m_sn_block0.m_purged
       && sn1 >= m_sn_block0.m_sn0
       && sn0 <= m_sn_block0.m_sn1
       && !m_sn_block0.m_sorted
     )
  {
    if ( !m_sn_block0.m_sorted )
    {
      if ( m_sn_block0.m_purged > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
        const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
        const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
        const_cast<ON_SerialNumberMap*>(this)->UpdateMaxSNHelper();
      }
      if ( m_sn_block0.m_count > 0 )
      {
        // memory location for specific elements will be changed.
        // This will make the hash table invalid.
        const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();
        const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();
        if ( sn1 >= m_sn_block0.m_sn0 && sn0 <= m_sn_block0.m_sn1 )
        {
          i = m_sn_block0.m_count;
          ei = &m_sn_block0.m_sn[0];
        }
      }
    }
    else
    {
      i = m_sn_block0.m_count;
      ei = &m_sn_block0.m_sn[0];
      while ( ei->m_sn < sn0 || !ei->m_sn_active )
      {
        if ( --i )
          ei++;
        else
        {
          ei = 0;
          break;
        }
      }
      if ( ei && ei->m_sn > sn1 )
      {
        ei = 0;
      }
    }
  }

  // adjust c = estimate of number of items in m_snblk_list[]
  if ( ei )
    c += m_sn_block0.ActiveElementEstimate(ei->m_sn,sn1);
  if (c > (sn1-sn0+1) )
    c = (sn1-sn0+1);
  if ( c > 2*4096 )
    c = 2*4096;

  // reserve room for elements so we don't thrash memory
  // while growing a large dynamic array.
  elements.Reserve(elements.Count()+((int)c));

  // Add appropriate elements to elements[] array.
  while (ei || ek)
  {
    if (ei && (!ek || ei->m_sn < ek->m_sn) )
    {
      if ( ei->m_sn_active )
        elements.Append(*ei);
      if ( --i )
      {
        if ( (++ei)->m_sn > sn1 )
        {
          ei = 0;
        }
      }
      else
      {
        ei = 0;
      }
    }
    else 
    {
      if ( ek->m_sn_active )
        elements.Append(*ek);
      if ( --k )
      {
        if ( (++ek)->m_sn > sn1 )
        {
          ek = 0;
        }
      }
      else if (++j < m_snblk_list_count && sn1 <= m_snblk_list[j]->m_sn0 )
      {
        k = m_snblk_list[j]->m_count; // always > 0
        ek = &m_snblk_list[j]->m_sn[0];
      }
      else 
      {
        ek = 0;
      }
    }
  }
  
  return (elements.Count() - elements_count0);
}